

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_utils.hpp
# Opt level: O0

float xsimd::bit_cast<float,unsigned_int>(uint val)

{
  float res;
  uint val_local;
  
  return (float)val;
}

Assistant:

inline To bit_cast(From val) noexcept
    {
        static_assert(sizeof(From) == sizeof(To), "casting between compatible layout");
        // FIXME: Some old version of GCC don't support that trait
        // static_assert(std::is_trivially_copyable<From>::value, "input type is trivially copyable");
        // static_assert(std::is_trivially_copyable<To>::value, "output type is trivially copyable");
        To res;
        std::memcpy(&res, &val, sizeof(val));
        return res;
    }